

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rbuVfsWrite(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  sqlite3_io_methods *psVar1;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *p_Var2;
  uint uVar3;
  int iVar4;
  sqlite3_io_methods *psVar5;
  undefined4 in_register_00000014;
  long lVar6;
  u8 *pBuf;
  
  psVar1 = pFile[3].pMethods;
  if (psVar1 != (sqlite3_io_methods *)0x0) {
    if (psVar1->iVersion == 1) {
      uVar3 = *(uint *)&pFile[5].pMethods;
      if (((uVar3 >> 0x13 & 1) != 0) && ((long)psVar1[1].xShmBarrier <= iOfst)) {
        psVar1[1].xShmBarrier = (_func_void_sqlite3_file_ptr *)(iAmt + iOfst);
        goto LAB_001d332d;
      }
    }
    else {
      if (psVar1->iVersion == 3) {
        *(int *)(*(long *)(psVar1 + 2) + -8 + (long)*(int *)&psVar1[1].xUnfetch * 8) =
             (int)(iOfst / (long)*(int *)&psVar1[2].xClose) + 1;
        return 0;
      }
      uVar3 = *(uint *)&pFile[5].pMethods;
    }
    if ((uVar3 & 8) != 0) {
      psVar5 = (sqlite3_io_methods *)(iAmt + iOfst);
      lVar6 = (long)psVar5 - (long)pFile[4].pMethods;
      if (lVar6 != 0 && (long)pFile[4].pMethods <= (long)psVar5) {
        p_Var2 = psVar1[2].xTruncate;
        psVar1[2].xTruncate = p_Var2 + lVar6;
        pFile[4].pMethods = psVar5;
        if ((psVar1[2].xSync != (_func_int_sqlite3_file_ptr_int *)0x0) &&
           ((long)psVar1[2].xSync < (long)(p_Var2 + lVar6))) {
          return 0xd;
        }
      }
    }
  }
LAB_001d332d:
  iVar4 = (**(code **)(*(long *)pFile[1].pMethods + 0x18))
                    (pFile[1].pMethods,zBuf,CONCAT44(in_register_00000014,iAmt),iOfst);
  if ((iOfst == 0 && iVar4 == 0) && (iVar4 = 0, ((ulong)pFile[5].pMethods & 0x100) != 0)) {
    uVar3 = *(uint *)((long)zBuf + 0x18);
    *(uint *)((long)&pFile[5].pMethods + 4) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    *(undefined1 *)&pFile[6].pMethods = *(undefined1 *)((long)zBuf + 0x13);
  }
  return iVar4;
}

Assistant:

static int rbuVfsWrite(
  sqlite3_file *pFile, 
  const void *zBuf, 
  int iAmt, 
  sqlite_int64 iOfst
){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc;

  if( pRbu && pRbu->eStage==RBU_STAGE_CAPTURE ){
    assert( p->openFlags & SQLITE_OPEN_MAIN_DB );
    rc = rbuCaptureDbWrite(p->pRbu, iOfst);
  }else{
    if( pRbu ){
      if( pRbu->eStage==RBU_STAGE_OAL 
       && (p->openFlags & SQLITE_OPEN_WAL) 
       && iOfst>=pRbu->iOalSz
      ){
        pRbu->iOalSz = iAmt + iOfst;
      }else if( p->openFlags & SQLITE_OPEN_DELETEONCLOSE ){
        i64 szNew = iAmt+iOfst;
        if( szNew>p->sz ){
          rc = rbuUpdateTempSize(p, szNew);
          if( rc!=SQLITE_OK ) return rc;
        }
      }
    }
    rc = p->pReal->pMethods->xWrite(p->pReal, zBuf, iAmt, iOfst);
    if( rc==SQLITE_OK && iOfst==0 && (p->openFlags & SQLITE_OPEN_MAIN_DB) ){
      /* These look like magic numbers. But they are stable, as they are part
      ** of the definition of the SQLite file format, which may not change. */
      u8 *pBuf = (u8*)zBuf;
      p->iCookie = rbuGetU32(&pBuf[24]);
      p->iWriteVer = pBuf[19];
    }
  }
  return rc;
}